

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O0

void glcts::fillData<int>
               (int *data,GLuint width,GLuint height,GLuint depth,GLuint components,int base)

{
  uint local_34;
  uint local_30;
  GLuint l;
  GLuint k;
  GLuint j;
  GLuint i;
  int base_local;
  GLuint components_local;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  int *data_local;
  
  for (k = 0; k < depth; k = k + 1) {
    for (l = 0; l < width; l = l + 1) {
      for (local_30 = 0; local_30 < height; local_30 = local_30 + 1) {
        for (local_34 = 0; local_34 < components; local_34 = local_34 + 1) {
          data[k * width * height * components + l * height * components + local_30 * components +
               local_34] = base + k;
        }
      }
    }
  }
  return;
}

Assistant:

void fillData(T* data, glw::GLuint width, glw::GLuint height, glw::GLuint depth, glw::GLuint components, T base)
{
	for (glw::GLuint i = 0; i < depth; ++i)
	{
		for (glw::GLuint j = 0; j < width; ++j)
		{
			for (glw::GLuint k = 0; k < height; ++k)
			{
				for (glw::GLuint l = 0; l < components; ++l)
				{
					data[i * width * height * components + j * height * components + k * components + l] = base + (T)i;
				}
			}
		}
	}
}